

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

hbtrie_result hbtrie_iterator_init(hbtrie *trie,hbtrie_iterator *it,void *initial_key,size_t keylen)

{
  int iVar1;
  void *pvVar2;
  long in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  int in_stack_fffffffffffffffc;
  
  memcpy(in_RSI,in_RDI,0x70);
  pvVar2 = malloc((ulong)*in_RSI);
  *(void **)(in_RSI + 0x68) = pvVar2;
  memset(*(void **)(in_RSI + 0x68),0xff,(ulong)*in_RSI);
  pvVar2 = malloc(0x10000);
  *(void **)(in_RSI + 0x80) = pvVar2;
  if (in_RDX == 0) {
    in_RSI[0x88] = 0;
    in_RSI[0x89] = 0;
    in_RSI[0x8a] = 0;
    in_RSI[0x8b] = 0;
    in_RSI[0x8c] = 0;
    in_RSI[0x8d] = 0;
    in_RSI[0x8e] = 0;
    in_RSI[0x8f] = 0;
    memset(*(void **)(in_RSI + 0x80),0,(ulong)*in_RDI);
  }
  else {
    iVar1 = _hbtrie_reform_key((hbtrie *)initial_key,(void *)keylen,in_stack_fffffffffffffffc,in_RDI
                              );
    *(long *)(in_RSI + 0x88) = (long)iVar1;
    if (0xffff < *(ulong *)(in_RSI + 0x88)) {
      free(*(void **)(in_RSI + 0x80));
      return HBTRIE_RESULT_FAIL;
    }
    memset((void *)(*(long *)(in_RSI + 0x80) + *(long *)(in_RSI + 0x88)),0,(ulong)*in_RDI);
  }
  list_init((list *)(in_RSI + 0x70));
  in_RSI[0x90] = 0;
  return HBTRIE_RESULT_SUCCESS;
}

Assistant:

hbtrie_result hbtrie_iterator_init(struct hbtrie *trie,
                                   struct hbtrie_iterator *it,
                                   void *initial_key,
                                   size_t keylen)
{
    it->trie = *trie;

    // MUST NOT affect the original trie due to sharing the same memory segment
    it->trie.last_map_chunk = (void *)malloc(it->trie.chunksize);
    memset(it->trie.last_map_chunk, 0xff, it->trie.chunksize);

    it->curkey = (void *)malloc(HBTRIE_MAX_KEYLEN);

    if (initial_key) {
        it->keylen = _hbtrie_reform_key(trie, initial_key, keylen, it->curkey);
        if (it->keylen >= HBTRIE_MAX_KEYLEN) {
            free(it->curkey);
            DBG("Error: HBTrie iterator init fails because the init key length %d is "
                "greater than the max key length %d\n", it->keylen, HBTRIE_MAX_KEYLEN);
            return HBTRIE_RESULT_FAIL;
        }
        memset((uint8_t*)it->curkey + it->keylen, 0, trie->chunksize);
    }else{
        it->keylen = 0;
        memset(it->curkey, 0, trie->chunksize);
    }
    list_init(&it->btreeit_list);
    it->flags = 0;

    return HBTRIE_RESULT_SUCCESS;
}